

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::detail::validUtf8(string *utf8String)

{
  uint state;
  bool bVar1;
  uint8_t *puVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  uint32_t local_28;
  uint local_24;
  uint32_t codepoint;
  uint utf8_state;
  const_iterator iter;
  string *utf8String_local;
  
  iter._M_current = (char *)utf8String;
  _codepoint = (char *)std::__cxx11::string::begin();
  local_24 = 0;
  local_28 = 0;
  do {
    local_30._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&codepoint,&local_30);
    state = local_24;
    if (!bVar1) {
      if (local_24 != 0) {
        return false;
      }
      return true;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&codepoint,0);
    puVar2 = (uint8_t *)
             __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    local_24 = consumeUtf8Fragment(state,*puVar2,&local_28);
  } while (local_24 != 8);
  return false;
}

Assistant:

GHC_INLINE bool validUtf8(const std::string& utf8String)
{
    std::string::const_iterator iter = utf8String.begin();
    unsigned utf8_state = S_STRT;
    std::uint32_t codepoint = 0;
    while (iter < utf8String.end()) {
        if ((utf8_state = consumeUtf8Fragment(utf8_state, static_cast<uint8_t>(*iter++), codepoint)) == S_RJCT) {
            return false;
        }
    }
    if (utf8_state) {
        return false;
    }
    return true;
}